

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  int iVar1;
  uint uVar2;
  ExprList_item *pEVar3;
  char *__src;
  char *z;
  
  if (pList != (ExprList *)0x0) {
    iVar1 = pList->nExpr;
    pEVar3 = pList->a;
    __src = pName->z;
    if (__src == (char *)0x0) {
      z = (char *)0x0;
    }
    else {
      uVar2 = pName->n;
      z = (char *)sqlite3DbMallocRaw(pParse->db,uVar2 + 1);
      if (z != (char *)0x0) {
        memcpy(z,__src,(long)(int)uVar2);
        z[(int)uVar2] = '\0';
      }
    }
    pEVar3[(long)iVar1 + -1].zName = z;
    if ((dequote != 0) && (z != (char *)0x0)) {
      sqlite3Dequote(z);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  Token *pName,           /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zName==0 );
    pItem->zName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote && pItem->zName ) sqlite3Dequote(pItem->zName);
  }
}